

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

point_t * opengv::triangulation::triangulate
                    (point_t *__return_storage_ptr__,RelativeAdapterBase *adapter,size_t index)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  double dVar8;
  undefined1 *puVar9;
  double *pdVar10;
  ActualDstType actualDst;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  Index IVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Packet2d mask;
  MatrixXd A;
  bearingVector_t f2;
  bearingVector_t f1;
  Matrix<double,_3,_4,_0,_3,_4> P2;
  Matrix<double,_3,_4,_0,_3,_4> P1;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> mySVD;
  DenseStorage<double,__1,__1,__1,_0> local_3e0;
  ulong local_3c0;
  double local_3b8;
  double dStack_3b0;
  ulong local_3a0;
  double local_398;
  double dStack_390;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined1 auStack_360 [16];
  double dStack_350;
  double dStack_348;
  double local_340;
  undefined1 local_338 [16];
  double local_328;
  undefined1 auStack_301 [9];
  undefined1 auStack_2f8 [8];
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_290;
  undefined1 auVar24 [64];
  
  dVar2 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0];
  dVar8 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1];
  auVar3 = *(undefined1 (*) [16])
            (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array;
  dStack_350 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dStack_350;
  auVar32 = *(undefined1 (*) [16])
             ((adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
              .m_data.array + 3);
  dStack_348 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[5];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dStack_348;
  auVar4 = *(undefined1 (*) [16])
            ((adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array + 6);
  local_340 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
              .m_data.array[8];
  dVar1 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2];
  uStack_2b8 = 0;
  uStack_2b0 = 0;
  uStack_2a8 = 0;
  auStack_301._1_8_ = 0x3ff0000000000000;
  auStack_2f8 = (undefined1  [8])0x0;
  uStack_2f0 = 0;
  uStack_2e8 = 0;
  uStack_2e0 = 0x3ff0000000000000;
  uStack_2d8 = 0;
  uStack_2d0 = 0;
  uStack_2c8 = 0;
  local_2c0 = 0x3ff0000000000000;
  local_380 = vunpcklpd_avx(auVar3,auVar32);
  auStack_370 = vblendpd_avx(auVar4,auVar3,2);
  auStack_360 = vunpckhpd_avx(auVar32,auVar4);
  auVar27._0_8_ = dVar2 * -auVar3._0_8_ + dVar8 * -auVar3._8_8_;
  auVar27._8_8_ = dVar2 * -auVar32._0_8_ + dVar8 * -auVar32._8_8_;
  auVar3 = vunpcklpd_avx(auVar31,auVar33);
  auVar32._0_8_ = dVar1 * auVar3._0_8_;
  auVar32._8_8_ = dVar1 * auVar3._8_8_;
  local_338 = vsubpd_avx(auVar27,auVar32);
  local_328 = (dVar2 * -auVar4._0_8_ + dVar8 * -auVar4._8_8_) - dVar1 * local_340;
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_3a0);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_3c0,adapter,index);
  local_3e0.m_cols = 0;
  local_3e0.m_data = (double *)0x0;
  local_3e0.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_3e0,0x10,4,4);
  auVar14 = vpbroadcastq_avx512f();
  if (0 < local_3e0.m_cols) {
    uVar12 = local_3e0.m_cols + 7U & 0xfffffffffffffff8;
    auVar15 = vpbroadcastq_avx512f();
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_3a0;
    auVar16 = vbroadcastsd_avx512f(auVar3);
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dStack_390;
    auVar18 = vbroadcastsd_avx512f(auVar4);
    auVar19 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      uVar7 = vpcmpuq_avx512f(auVar17,auVar15,2);
      auVar21 = vpmullq_avx512dq(auVar17,auVar14);
      vpmullq_avx512dq(auVar17,auVar19);
      auVar22 = vgatherqpd_avx512f(*(undefined8 *)(auStack_2f8 + local_3e0.m_cols + 7));
      auVar23._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar22._8_8_;
      auVar23._0_8_ = (ulong)((byte)uVar7 & 1) * auVar22._0_8_;
      auVar23._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar22._16_8_;
      auVar23._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar22._24_8_;
      auVar23._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar22._32_8_;
      auVar23._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar22._40_8_;
      auVar23._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar22._48_8_;
      auVar23._56_8_ = (uVar7 >> 7) * auVar22._56_8_;
      auVar22 = vmulpd_avx512f(auVar16,auVar23);
      auVar23 = vgatherqpd_avx512f(*(undefined8 *)(auStack_301 + local_3e0.m_cols));
      auVar24._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar23._8_8_;
      auVar24._0_8_ = (ulong)((byte)uVar7 & 1) * auVar23._0_8_;
      auVar24._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar23._16_8_;
      auVar24._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar23._24_8_;
      auVar24._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar23._32_8_;
      auVar24._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar23._40_8_;
      auVar24._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar23._48_8_;
      auVar24._56_8_ = (uVar7 >> 7) * auVar23._56_8_;
      auVar23 = vmulpd_avx512f(auVar18,auVar24);
      auVar22 = vsubpd_avx512f(auVar22,auVar23);
      vscatterqpd_avx512f(ZEXT864(local_3e0.m_data) + auVar21 * (undefined1  [64])0x8,uVar7,auVar22)
      ;
      auVar17 = vpaddq_avx512f(auVar17,auVar20);
      uVar12 = uVar12 - 8;
    } while (uVar12 != 0);
  }
  if (0 < local_3e0.m_cols) {
    pauVar11 = (undefined1 (*) [16])auStack_2f8;
    pdVar10 = local_3e0.m_data + 1;
    IVar13 = local_3e0.m_cols;
    do {
      auVar3 = vpermilpd_avx(*pauVar11,1);
      auVar29._0_8_ = local_398 * auVar3._0_8_;
      auVar29._8_8_ = dStack_390 * auVar3._8_8_;
      auVar3 = vhsubpd_avx(auVar29,auVar29);
      dVar1 = (double)vmovlpd_avx(auVar3);
      *pdVar10 = dVar1;
      pauVar11 = (undefined1 (*) [16])(pauVar11[1] + 8);
      pdVar10 = pdVar10 + local_3e0.m_rows;
      IVar13 = IVar13 + -1;
    } while (IVar13 != 0);
  }
  if (0 < local_3e0.m_cols) {
    uVar12 = local_3e0.m_cols + 7U & 0xfffffffffffffff8;
    auVar15 = vpbroadcastq_avx512f();
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_3c0;
    auVar16 = vbroadcastsd_avx512f(auVar5);
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dStack_3b0;
    auVar18 = vbroadcastsd_avx512f(auVar6);
    auVar19 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      uVar7 = vpcmpuq_avx512f(auVar17,auVar15,2);
      auVar21 = vpmullq_avx512dq(auVar17,auVar14);
      vpmullq_avx512dq(auVar17,auVar19);
      auVar22 = vgatherqpd_avx512f(*(undefined8 *)(auStack_370 + uVar12));
      auVar25._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar22._8_8_;
      auVar25._0_8_ = (ulong)((byte)uVar7 & 1) * auVar22._0_8_;
      auVar25._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar22._16_8_;
      auVar25._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar22._24_8_;
      auVar25._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar22._32_8_;
      auVar25._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar22._40_8_;
      auVar25._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar22._48_8_;
      auVar25._56_8_ = (uVar7 >> 7) * auVar22._56_8_;
      auVar22 = vmulpd_avx512f(auVar16,auVar25);
      auVar23 = vgatherqpd_avx512f(*(undefined8 *)(local_380 + uVar12));
      auVar26._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar23._8_8_;
      auVar26._0_8_ = (ulong)((byte)uVar7 & 1) * auVar23._0_8_;
      auVar26._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar23._16_8_;
      auVar26._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar23._24_8_;
      auVar26._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar23._32_8_;
      auVar26._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar23._40_8_;
      auVar26._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar23._48_8_;
      auVar26._56_8_ = (uVar7 >> 7) * auVar23._56_8_;
      auVar23 = vmulpd_avx512f(auVar18,auVar26);
      auVar22 = vsubpd_avx512f(auVar22,auVar23);
      vscatterqpd_avx512f(ZEXT864(local_3e0.m_data + 2) + auVar21 * (undefined1  [64])0x8,uVar7,
                          auVar22);
      auVar17 = vpaddq_avx512f(auVar17,auVar20);
      uVar12 = uVar12 - 8;
    } while (uVar12 != 0);
  }
  if (0 < local_3e0.m_cols) {
    puVar9 = local_380;
    pdVar10 = local_3e0.m_data + 3;
    IVar13 = local_3e0.m_cols;
    do {
      auVar3 = vpermilpd_avx(*(undefined1 (*) [16])(puVar9 + 8),1);
      auVar28._0_8_ = local_3b8 * auVar3._0_8_;
      auVar28._8_8_ = dStack_3b0 * auVar3._8_8_;
      auVar3 = vhsubpd_avx(auVar28,auVar28);
      dVar1 = (double)vmovlpd_avx(auVar3);
      *pdVar10 = dVar1;
      puVar9 = ((undefined1 (*) [16])(puVar9 + 8))[1];
      pdVar10 = pdVar10 + local_3e0.m_rows;
      IVar13 = IVar13 + -1;
    } while (IVar13 != 0);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_290,(MatrixType *)&local_3e0,0x10);
  auVar3 = *(undefined1 (*) [16])
            (local_290.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + local_290.
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                      m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows * 3);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar3;
  dVar1 = local_290.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[local_290.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 3 + 2];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar1;
  dVar2 = local_290.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[local_290.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 3 + 3];
  auVar30._8_8_ = dVar2;
  auVar30._0_8_ = dVar2;
  auVar3 = vdivpd_avx(auVar3,auVar30);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar1 / dVar2;
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_290);
  if (local_3e0.m_data != (double *)0x0) {
    free((void *)local_3e0.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::point_t
opengv::triangulation::triangulate(
    const relative_pose::RelativeAdapterBase & adapter,
    size_t index )
{
  translation_t t12 = adapter.gett12();
  rotation_t R12 = adapter.getR12();
  Eigen::Matrix<double,3,4> P1 = Eigen::Matrix<double,3,4>::Zero();
  P1.block<3,3>(0,0) = Eigen::Matrix3d::Identity();
  Eigen::Matrix<double,3,4> P2 = Eigen::Matrix<double,3,4>::Zero();
  P2.block<3,3>(0,0) = R12.transpose();
  P2.block<3,1>(0,3) = -R12.transpose()*t12;
  bearingVector_t f1 = adapter.getBearingVector1(index);
  bearingVector_t f2 = adapter.getBearingVector2(index);

  Eigen::MatrixXd A(4,4);
  A.row(0) = f1[0] * P1.row(2) - f1[2] * P1.row(0);
  A.row(1) = f1[1] * P1.row(2) - f1[2] * P1.row(1);
  A.row(2) = f2[0] * P2.row(2) - f2[2] * P2.row(0);
  A.row(3) = f2[1] * P2.row(2) - f2[2] * P2.row(1);

  Eigen::JacobiSVD< Eigen::MatrixXd > mySVD(A, Eigen::ComputeFullV );
  point_t worldPoint;
  worldPoint[0] = mySVD.matrixV()(0,3);
  worldPoint[1] = mySVD.matrixV()(1,3);
  worldPoint[2] = mySVD.matrixV()(2,3);
  worldPoint = worldPoint / mySVD.matrixV()(3,3);

  return worldPoint;
}